

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
          (ImmutableStringFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  pointer pcVar1;
  OneofDescriptor *pOVar2;
  undefined8 uVar3;
  bool bVar4;
  Type TVar5;
  ClassNameResolver *pCVar6;
  FieldGeneratorInfo *info;
  Nonnull<char_*> pcVar7;
  uint uVar8;
  char *pcVar9;
  int bitIndex;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar10;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  size_type sVar11;
  AlphaNum *pAVar12;
  Options *options;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined1 local_1b8 [36];
  uint local_194;
  undefined1 local_190 [36];
  uint local_16c;
  undefined1 local_168 [32];
  undefined8 local_148;
  char *local_140;
  undefined8 local_138;
  size_type local_130;
  undefined8 local_128;
  char *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_e8;
  undefined1 local_d0 [8];
  anon_union_8_1_a8a14541_for_iterator_2 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  (this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__ImmutableStringOneofFieldGenerator_0082b020;
  this->descriptor_ = descriptor;
  this->message_bit_index_ = messageBitIndex;
  this->builder_bit_index_ = builderBitIndex;
  variables = &this->variables_;
  (this->variables_).
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  *(size_t *)
   ((long)&(this->variables_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   8) = 0;
  (((HeapOrSoo *)
   ((long)&(this->variables_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x10))->heap).control = (ctrl_t *)0x6f6b50;
  this->context_ = context;
  local_194 = builderBitIndex;
  local_16c = messageBitIndex;
  pCVar6 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar6;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  pCVar6 = this->name_resolver_;
  SetCommonFieldVariables(descriptor,info,variables);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [11])"empty_list");
  options = (Options *)0x33;
  std::__cxx11::string::_M_replace
            (local_168._8_8_ + 0x10,0,*(char **)(local_168._8_8_ + 0x18),0x62849a);
  local_80[0] = (context->options_).generate_immutable_code;
  local_80[1] = (context->options_).generate_mutable_code;
  local_80[2] = (context->options_).generate_shared_code;
  local_80[3] = (context->options_).enforce_lite;
  local_80[4] = (context->options_).opensource_runtime;
  local_80[5] = (context->options_).annotate_code;
  pcVar1 = (context->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,
             pcVar1 + (context->options_).annotation_list_file._M_string_length);
  pcVar1 = (context->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,
             pcVar1 + (context->options_).output_list_file._M_string_length);
  local_38._0_1_ = (context->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (context->options_).jvm_dsl;
  ImmutableDefaultValue_abi_cxx11_
            ((string *)local_168,(java *)descriptor,(FieldDescriptor *)pCVar6,
             (ClassNameResolver *)local_80,options);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[8]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_d0,variables,(char (*) [8])0x63c5aa);
  std::__cxx11::string::operator=((string *)((long)local_c8.slot_ + 0x10),(string *)local_168);
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  local_168._0_8_ = (ctrl_t *)0x2;
  local_168._8_8_ = "= ";
  local_d0[0] = (context->options_).generate_immutable_code;
  local_d0[1] = (context->options_).generate_mutable_code;
  local_d0[2] = (context->options_).generate_shared_code;
  local_d0[3] = (context->options_).enforce_lite;
  local_d0[4] = (context->options_).opensource_runtime;
  local_d0[5] = (context->options_).annotate_code;
  pcVar1 = (context->options_).annotation_list_file._M_dataplus._M_p;
  local_c8.slot_ = (slot_type *)(local_d0 + 0x18);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_d0 + 8),pcVar1,
             pcVar1 + (context->options_).annotation_list_file._M_string_length);
  pcVar1 = (context->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,
             pcVar1 + (context->options_).output_list_file._M_string_length);
  local_88._0_1_ = (context->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (context->options_).jvm_dsl;
  ImmutableDefaultValue_abi_cxx11_
            ((string *)local_190,(java *)descriptor,(FieldDescriptor *)pCVar6,
             (ClassNameResolver *)local_d0,options);
  local_118._0_8_ = local_190._8_8_;
  local_118._8_8_ = local_190._0_8_;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_1b8,(lts_20250127 *)local_168,(AlphaNum *)local_118,
             (AlphaNum *)local_190._8_8_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>(&local_e8,variables,(char (*) [13])"default_init");
  std::__cxx11::string::operator=
            ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_1b8);
  if ((AlphaNum *)local_1b8._0_8_ != (AlphaNum *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  }
  if ((slot_type *)local_190._0_8_ != (slot_type *)(local_190 + 0x10)) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if (local_c8.slot_ != (slot_type *)(local_d0 + 0x18)) {
    operator_delete(local_c8.slot_,local_b8._M_allocated_capacity + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [17])"capitalized_type");
  std::__cxx11::string::_M_replace
            ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x53826e);
  iVar10 = descriptor->number_;
  bVar4 = FieldDescriptor::is_packed(descriptor);
  uVar8 = 2;
  if (!bVar4) {
    uVar8 = *(uint *)(protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)descriptor->type_ * 4);
  }
  pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (iVar10 << 3 | uVar8,local_168 + 0x10);
  local_168._8_8_ = local_168 + 0x10;
  local_168._0_8_ = pcVar7 + -local_168._8_8_;
  local_118._0_8_ = (AlphaNum *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,local_168._8_8_,pcVar7);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[4]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1b8,variables,(char (*) [4])0x5bcf0c);
  std::__cxx11::string::operator=((string *)(local_1b8._8_8_ + 0x10),(string *)local_118);
  if ((AlphaNum *)local_118._0_8_ != (AlphaNum *)local_108) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
  }
  iVar10 = descriptor->number_;
  TVar5 = GetType(descriptor);
  uVar8 = iVar10 * 8 + 1;
  iVar10 = 0x1f;
  if (uVar8 != 0) {
    for (; uVar8 >> iVar10 == 0; iVar10 = iVar10 + -1) {
    }
  }
  pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((ulong)(iVar10 * 9 + 0x49U >> 6) << (TVar5 == TYPE_GROUP),local_168 + 0x10);
  local_168._8_8_ = local_168 + 0x10;
  local_168._0_8_ = pcVar7 + -local_168._8_8_;
  local_118._0_8_ = (AlphaNum *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,local_168._8_8_,pcVar7);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1b8,variables,(char (*) [9])"tag_size");
  std::__cxx11::string::operator=
            ((string *)(local_1b8._8_8_ + 0x10),(string *)&((slot_type *)local_118)->value);
  if ((AlphaNum *)local_118._0_8_ != (AlphaNum *)local_108) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [11])0x61a7e9);
  std::__cxx11::string::_M_replace
            ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x625adc);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [14])0x6284f3);
  std::__cxx11::string::_M_replace
            ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x6284ce);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [12])0x628526);
  std::__cxx11::string::_M_replace
            ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x628501);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[18]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [18])0x628557);
  std::__cxx11::string::_M_replace
            ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x628532);
  bVar4 = (descriptor->options_->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [12])0x633a99);
  pcVar9 = "";
  if (bVar4 != false) {
    pcVar9 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),(ulong)pcVar9);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_168,variables,(char (*) [11])"on_changed");
  std::__cxx11::string::_M_replace
            ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x61a8ee);
  bVar4 = FieldDescriptor::has_presence(descriptor);
  if (bVar4) {
    if ((descriptor->field_0x3 & 1) != 0) {
      if ((descriptor->field_0x1 & 0x10) == 0) {
        iVar10 = 0xb63;
LAB_00331ec2:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,iVar10);
      }
      pOVar2 = (descriptor->scope_).containing_oneof;
      if (pOVar2 == (OneofDescriptor *)0x0) {
        iVar10 = 0xb31;
        goto LAB_00331ec2;
      }
      if ((pOVar2->field_count_ == 1) && ((pOVar2->fields_->field_0x1 & 2) != 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb64,"!res->is_synthetic()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_168);
      }
      goto LAB_00331947;
    }
    GenerateSetBitToLocal_abi_cxx11_((string *)local_168,(java *)(ulong)local_16c,bitIndex);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[27]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_118,variables,(char (*) [27])"set_has_field_bit_to_local");
    std::__cxx11::string::operator=((string *)(local_118._8_8_ + 0x10),(string *)local_168);
    iVar10 = extraout_EDX_01;
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      iVar10 = extraout_EDX_02;
    }
    GenerateSetBit_abi_cxx11_((string *)local_190,(java *)(ulong)local_16c,iVar10);
    local_168._0_8_ = local_190._8_8_;
    local_168._8_8_ = local_190._0_8_;
    local_118._0_8_ = 1;
    local_118._8_8_ = ";";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_1b8,(lts_20250127 *)local_168,(AlphaNum *)local_118,
               (AlphaNum *)local_190._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[26]>
              (&local_e8,variables,(char (*) [26])"set_has_field_bit_message");
    std::__cxx11::string::operator=
              ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_1b8);
    iVar10 = extraout_EDX_03;
    if ((AlphaNum *)local_1b8._0_8_ != (AlphaNum *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
      iVar10 = extraout_EDX_04;
    }
    if ((slot_type *)local_190._0_8_ != (slot_type *)(local_190 + 0x10)) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
      iVar10 = extraout_EDX_05;
    }
    GenerateGetBit_abi_cxx11_((string *)local_168,(java *)(ulong)local_16c,iVar10);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[25]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_118,variables,(char (*) [25])"is_field_present_message");
    std::__cxx11::string::operator=((string *)(local_118._8_8_ + 0x10),(string *)local_168);
    sVar11 = local_168._16_8_;
    pAVar12 = (AlphaNum *)local_168._0_8_;
    iVar10 = extraout_EDX_06;
    if ((AlphaNum *)local_168._0_8_ == (AlphaNum *)(local_168 + 0x10)) goto LAB_00331c78;
  }
  else {
LAB_00331947:
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[27]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_168,variables,(char (*) [27])"set_has_field_bit_to_local");
    std::__cxx11::string::_M_replace
              ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x4f289c);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[26]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_168,variables,(char (*) [26])"set_has_field_bit_message");
    std::__cxx11::string::_M_replace
              ((ulong)(local_168._8_8_ + 0x10),0,*(char **)(local_168._8_8_ + 0x18),0x4f289c);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_168,variables,(char (*) [14])0x6284f3);
    uVar3 = *(undefined8 *)(local_168._8_8_ + 0x10);
    sVar11 = *(size_type *)(local_168._8_8_ + 0x18);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[5]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_168,variables,(char (*) [5])0x6fff3e);
    local_130 = *(size_type *)(local_168._8_8_ + 0x10);
    local_138 = *(undefined8 *)(local_168._8_8_ + 0x18);
    local_168._0_8_ = (AlphaNum *)0x1;
    local_168._8_8_ = "!";
    local_148 = 1;
    local_140 = "(";
    local_128 = 2;
    local_120 = "_)";
    pieces._M_len = local_130;
    pieces._M_array = (iterator)&DAT_00000005;
    local_168._16_8_ = sVar11;
    local_168._24_8_ = uVar3;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              ((string *)local_1b8,(strings_internal *)local_168,pieces);
    local_118._0_8_ = 0x18;
    local_118._8_8_ = "is_field_present_message";
    if ((AlphaNum *)local_1b8._0_8_ == (AlphaNum *)(local_1b8 + 0x10)) {
      local_108._24_8_ = local_1b8._24_8_;
      local_108._0_8_ = local_108 + 0x10;
    }
    else {
      local_108._0_8_ = local_1b8._0_8_;
    }
    local_108._17_7_ = local_1b8._17_7_;
    local_108[0x10] = local_1b8[0x10];
    local_108._8_8_ = local_1b8._8_8_;
    local_1b8._8_8_ = (slot_type *)0x0;
    local_1b8[0x10] = '\0';
    local_1b8._0_8_ = (AlphaNum *)(local_1b8 + 0x10);
    local_190._0_8_ = (slot_type *)local_118;
    local_190._8_8_ = (AlphaNum *)local_108;
    local_e8.first.ctrl_ = (ctrl_t *)variables;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_168,&local_e8,&(((slot_type *)local_118)->value).first,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)local_190,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)(local_190 + 8));
    iVar10 = extraout_EDX;
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      iVar10 = extraout_EDX_00;
    }
    if ((AlphaNum *)local_1b8._0_8_ == (AlphaNum *)(local_1b8 + 0x10)) goto LAB_00331c78;
    sVar11 = CONCAT71(local_1b8._17_7_,local_1b8[0x10]);
    pAVar12 = (AlphaNum *)local_1b8._0_8_;
  }
  operator_delete(pAVar12,sVar11 + 1);
  iVar10 = extraout_EDX_07;
LAB_00331c78:
  GenerateGetBit_abi_cxx11_((string *)local_168,(java *)(ulong)local_194,iVar10);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[26]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_118,variables,(char (*) [26])"get_has_field_bit_builder");
  std::__cxx11::string::operator=((string *)(local_118._8_8_ + 0x10),(string *)local_168);
  iVar10 = extraout_EDX_08;
  if ((AlphaNum *)local_168._0_8_ != (AlphaNum *)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    iVar10 = extraout_EDX_09;
  }
  GenerateGetBitFromLocal_abi_cxx11_((string *)local_168,(java *)(ulong)local_194,iVar10);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[29]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_118,variables,(char (*) [29])"get_has_field_bit_from_local");
  std::__cxx11::string::operator=((string *)(local_118._8_8_ + 0x10),(string *)local_168);
  iVar10 = extraout_EDX_10;
  if ((AlphaNum *)local_168._0_8_ != (AlphaNum *)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    iVar10 = extraout_EDX_11;
  }
  GenerateSetBit_abi_cxx11_((string *)local_190,(java *)(ulong)local_194,iVar10);
  local_168._0_8_ = local_190._8_8_;
  local_168._8_8_ = local_190._0_8_;
  local_118._0_8_ = 1;
  local_118._8_8_ = ";";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_1b8,(lts_20250127 *)local_168,(AlphaNum *)local_118,
             (AlphaNum *)local_190._8_8_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[26]>
            (&local_e8,variables,(char (*) [26])"set_has_field_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_1b8);
  iVar10 = extraout_EDX_12;
  if ((AlphaNum *)local_1b8._0_8_ != (AlphaNum *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
    iVar10 = extraout_EDX_13;
  }
  if ((slot_type *)local_190._0_8_ != (slot_type *)(local_190 + 0x10)) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    iVar10 = extraout_EDX_14;
  }
  GenerateClearBit_abi_cxx11_((string *)local_190,(java *)(ulong)local_194,iVar10);
  local_168._0_8_ = local_190._8_8_;
  local_168._8_8_ = local_190._0_8_;
  local_118._0_8_ = 1;
  local_118._8_8_ = ";";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_1b8,(lts_20250127 *)local_168,(AlphaNum *)local_118,
             (AlphaNum *)local_190._8_8_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[28]>
            (&local_e8,variables,(char (*) [28])"clear_has_field_bit_builder");
  std::__cxx11::string::operator=
            ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_1b8);
  if ((AlphaNum *)local_1b8._0_8_ != (AlphaNum *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  }
  if ((slot_type *)local_190._0_8_ != (slot_type *)(local_190 + 0x10)) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  return;
}

Assistant:

ImmutableStringFieldGenerator::ImmutableStringFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor),
      message_bit_index_(messageBitIndex),
      builder_bit_index_(builderBitIndex),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  SetPrimitiveVariables(descriptor, messageBitIndex, builderBitIndex,
                        context->GetFieldGeneratorInfo(descriptor),
                        name_resolver_, &variables_, context);
}